

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHKeyConsistency_Test::TestBody(SSLTest_ECHKeyConsistency_Test *this)

{
  bool bVar1;
  int iVar2;
  SSL_ECH_KEYS *__p;
  char *pcVar3;
  evp_hpke_key_st *peVar4;
  EVP_HPKE_KEM *pEVar5;
  pointer psVar6;
  uchar *puVar7;
  size_type sVar8;
  char *in_R9;
  string local_628;
  AssertHelper local_608;
  Message local_600;
  bool local_5f1;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_5c0;
  Message local_5b8;
  bool local_5a9;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar__9;
  ECHConfigParams wrong_kem;
  AssertHelper local_4f0;
  Message local_4e8;
  bool local_4d9;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_4a8;
  Message local_4a0;
  bool local_491;
  undefined1 local_490 [8];
  AssertionResult gtest_ar__7;
  ECHConfigParams truncated;
  AssertHelper local_3d8;
  Message local_3d0;
  bool local_3c1;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_390;
  Message local_388;
  int local_37c;
  undefined1 local_378 [8];
  AssertionResult gtest_ar__5;
  ScopedEVP_HPKE_KEY wrong_key;
  AssertHelper local_2d8;
  Message local_2d0;
  int local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_290;
  Message local_288;
  bool local_279;
  undefined1 local_278 [8];
  AssertionResult gtest_ar__3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ech_config;
  ECHConfigParams params;
  AssertHelper local_1a8;
  Message local_1a0;
  int local_194;
  undefined1 local_190 [8];
  AssertionResult gtest_ar__2;
  size_t public_key_len;
  uint8_t public_key [65];
  string local_128;
  AssertHelper local_108;
  Message local_100;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__1;
  ScopedEVP_HPKE_KEY key;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL_ECH_KEYS> keys;
  SSLTest_ECHKeyConsistency_Test *this_local;
  
  __p = SSL_ECH_KEYS_new();
  std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter> *)&gtest_ar_.message_,__p);
  testing::AssertionResult::
  AssertionResult<std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x4dabc5,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x7ce,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    internal::
    StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
    ::StackAllocatedMovable
              ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                *)&gtest_ar__1.message_);
    peVar4 = internal::
             StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
             ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                    *)&gtest_ar__1.message_);
    pEVar5 = EVP_hpke_x25519_hkdf_sha256();
    local_f4 = EVP_HPKE_KEY_generate(peVar4,pEVar5);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_f0,&local_f4,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
    if (!bVar1) {
      testing::Message::Message(&local_100);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_128,(internal *)local_f0,
                 (AssertionResult *)
                 "EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,2000,pcVar3);
      testing::internal::AssertHelper::operator=(&local_108,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      testing::Message::~Message(&local_100);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
    if (bVar1) {
      peVar4 = internal::
               StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
               ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                      *)&gtest_ar__1.message_);
      local_194 = EVP_HPKE_KEY_public_key
                            (peVar4,(uint8_t *)&public_key_len,(size_t *)&gtest_ar__2.message_,0x41)
      ;
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_190,&local_194,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
      if (!bVar1) {
        testing::Message::Message(&local_1a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)
                   &params.extensions.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(internal *)local_190,
                   (AssertionResult *)
                   "EVP_HPKE_KEY_public_key(key.get(), public_key, &public_key_len, sizeof(public_key))"
                   ,"false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x7d4,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        std::__cxx11::string::~string
                  ((string *)
                   &params.extensions.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        testing::Message::~Message(&local_1a0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
      if (bVar1) {
        ECHConfigParams::ECHConfigParams
                  ((ECHConfigParams *)
                   &ech_config.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        params.public_name.field_2._8_8_ =
             internal::
             StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
             ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                    *)&gtest_ar__1.message_);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__3.message_);
        local_279 = MakeECHConfig((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &gtest_ar__3.message_,
                                  (ECHConfigParams *)
                                  &ech_config.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_278,&local_279,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
        if (!bVar1) {
          testing::Message::Message(&local_288);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_278,
                     (AssertionResult *)"MakeECHConfig(&ech_config, params)","false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_290,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x7da,pcVar3);
          testing::internal::AssertHelper::operator=(&local_290,&local_288);
          testing::internal::AssertHelper::~AssertHelper(&local_290);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_288);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
        if (bVar1) {
          psVar6 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                              &gtest_ar_.message_);
          puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &gtest_ar__3.message_);
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &gtest_ar__3.message_);
          peVar4 = internal::
                   StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                   ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                          *)&gtest_ar__1.message_);
          local_2c4 = SSL_ECH_KEYS_add(psVar6,1,puVar7,sVar8,peVar4);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_2c0,&local_2c4,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
          if (!bVar1) {
            testing::Message::Message(&local_2d0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)(wrong_key.ctx_.public_key + 0x40),(internal *)local_2c0,
                       (AssertionResult *)
                       "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                       ,"false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_2d8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x7dd,pcVar3);
            testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
            testing::internal::AssertHelper::~AssertHelper(&local_2d8);
            std::__cxx11::string::~string((string *)(wrong_key.ctx_.public_key + 0x40));
            testing::Message::~Message(&local_2d0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
          internal::
          StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
          ::StackAllocatedMovable
                    ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                      *)&gtest_ar__5.message_);
          peVar4 = internal::
                   StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                   ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                          *)&gtest_ar__5.message_);
          pEVar5 = EVP_hpke_x25519_hkdf_sha256();
          local_37c = EVP_HPKE_KEY_generate(peVar4,pEVar5);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_378,&local_37c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
          if (!bVar1) {
            testing::Message::Message(&local_388);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__6.message_,(internal *)local_378,
                       (AssertionResult *)
                       "EVP_HPKE_KEY_generate(wrong_key.get(), EVP_hpke_x25519_hkdf_sha256())",
                       "false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_390,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x7e2,pcVar3);
            testing::internal::AssertHelper::operator=(&local_390,&local_388);
            testing::internal::AssertHelper::~AssertHelper(&local_390);
            std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
            testing::Message::~Message(&local_388);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
          if (bVar1) {
            psVar6 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &gtest_ar__3.message_);
            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &gtest_ar__3.message_);
            peVar4 = internal::
                     StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                     ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                            *)&gtest_ar__5.message_);
            iVar2 = SSL_ECH_KEYS_add(psVar6,1,puVar7,sVar8,peVar4);
            local_3c1 = iVar2 == 0;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_3c0,&local_3c1,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
            if (!bVar1) {
              testing::Message::Message(&local_3d0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)
                         &truncated.extensions.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(internal *)local_3c0,
                         (AssertionResult *)
                         "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), wrong_key.get())"
                         ,"true","false",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_3d8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x7e5,pcVar3);
              testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
              testing::internal::AssertHelper::~AssertHelper(&local_3d8);
              std::__cxx11::string::~string
                        ((string *)
                         &truncated.extensions.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              testing::Message::~Message(&local_3d0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
            ECHConfigParams::ECHConfigParams((ECHConfigParams *)&gtest_ar__7.message_);
            truncated.public_name.field_2._8_8_ =
                 internal::
                 StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                 ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                        *)&gtest_ar__1.message_);
            std::vector<unsigned_char,std::allocator<unsigned_char>>::assign<unsigned_char*,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&truncated.kem_id,
                       (uchar *)&public_key_len,
                       (uchar *)((long)&gtest_ar__2.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                + (long)gtest_ar__2.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl + 7));
            local_491 = MakeECHConfig((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &gtest_ar__3.message_,(ECHConfigParams *)&gtest_ar__7.message_
                                     );
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_490,&local_491,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
            if (!bVar1) {
              testing::Message::Message(&local_4a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__8.message_,(internal *)local_490,
                         (AssertionResult *)"MakeECHConfig(&ech_config, truncated)","false","true",
                         in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_4a8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x7eb,pcVar3);
              testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
              testing::internal::AssertHelper::~AssertHelper(&local_4a8);
              std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
              testing::Message::~Message(&local_4a0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
            if (bVar1) {
              psVar6 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &gtest_ar__3.message_);
              sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &gtest_ar__3.message_);
              peVar4 = internal::
                       StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                       ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                              *)&gtest_ar__1.message_);
              iVar2 = SSL_ECH_KEYS_add(psVar6,1,puVar7,sVar8,peVar4);
              local_4d9 = iVar2 == 0;
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_4d8,&local_4d9,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
              if (!bVar1) {
                testing::Message::Message(&local_4e8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)
                           &wrong_kem.extensions.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_4d8,
                           (AssertionResult *)
                           "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                           ,"true","false",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_4f0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x7ee,pcVar3);
                testing::internal::AssertHelper::operator=(&local_4f0,&local_4e8);
                testing::internal::AssertHelper::~AssertHelper(&local_4f0);
                std::__cxx11::string::~string
                          ((string *)
                           &wrong_kem.extensions.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                testing::Message::~Message(&local_4e8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
              ECHConfigParams::ECHConfigParams((ECHConfigParams *)&gtest_ar__9.message_);
              wrong_kem.public_name.field_2._8_8_ =
                   internal::
                   StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                   ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                          *)&gtest_ar__1.message_);
              wrong_kem.key._0_2_ = 0x10;
              local_5a9 = MakeECHConfig((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        &gtest_ar__3.message_,
                                        (ECHConfigParams *)&gtest_ar__9.message_);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_5a8,&local_5a9,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
              if (!bVar1) {
                testing::Message::Message(&local_5b8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__10.message_,(internal *)local_5a8,
                           (AssertionResult *)"MakeECHConfig(&ech_config, wrong_kem)","false","true"
                           ,in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_5c0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x7f5,pcVar3);
                testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
                testing::internal::AssertHelper::~AssertHelper(&local_5c0);
                std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                testing::Message::~Message(&local_5b8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
              if (bVar1) {
                psVar6 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    &gtest_ar__3.message_);
                sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &gtest_ar__3.message_);
                peVar4 = internal::
                         StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                         ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                                *)&gtest_ar__1.message_);
                iVar2 = SSL_ECH_KEYS_add(psVar6,1,puVar7,sVar8,peVar4);
                local_5f1 = iVar2 == 0;
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_5f0,&local_5f1,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_5f0);
                if (!bVar1) {
                  testing::Message::Message(&local_600);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_628,(internal *)local_5f0,
                             (AssertionResult *)
                             "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                             ,"true","false",in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_608,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x7f8,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_608,&local_600);
                  testing::internal::AssertHelper::~AssertHelper(&local_608);
                  std::__cxx11::string::~string((string *)&local_628);
                  testing::Message::~Message(&local_600);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
              }
              ECHConfigParams::~ECHConfigParams((ECHConfigParams *)&gtest_ar__9.message_);
            }
            ECHConfigParams::~ECHConfigParams((ECHConfigParams *)&gtest_ar__7.message_);
          }
          internal::
          StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
          ::~StackAllocatedMovable
                    ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                      *)&gtest_ar__5.message_);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__3.message_);
        ECHConfigParams::~ECHConfigParams
                  ((ECHConfigParams *)
                   &ech_config.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    internal::
    StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
    ::~StackAllocatedMovable
              ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                *)&gtest_ar__1.message_);
  }
  std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SSLTest, ECHKeyConsistency) {
  bssl::UniquePtr<SSL_ECH_KEYS> keys(SSL_ECH_KEYS_new());
  ASSERT_TRUE(keys);
  bssl::ScopedEVP_HPKE_KEY key;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));
  uint8_t public_key[EVP_HPKE_MAX_PUBLIC_KEY_LENGTH];
  size_t public_key_len;
  ASSERT_TRUE(EVP_HPKE_KEY_public_key(key.get(), public_key, &public_key_len,
                                      sizeof(public_key)));

  // Adding an ECHConfig with the matching public key succeeds.
  ECHConfigParams params;
  params.key = key.get();
  std::vector<uint8_t> ech_config;
  ASSERT_TRUE(MakeECHConfig(&ech_config, params));
  EXPECT_TRUE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                               ech_config.data(), ech_config.size(),
                               key.get()));

  // Adding an ECHConfig with the wrong public key is an error.
  bssl::ScopedEVP_HPKE_KEY wrong_key;
  ASSERT_TRUE(
      EVP_HPKE_KEY_generate(wrong_key.get(), EVP_hpke_x25519_hkdf_sha256()));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                wrong_key.get()));

  // Adding an ECHConfig with a truncated public key is an error.
  ECHConfigParams truncated;
  truncated.key = key.get();
  truncated.public_key.assign(public_key, public_key + public_key_len - 1);
  ASSERT_TRUE(MakeECHConfig(&ech_config, truncated));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));

  // Adding an ECHConfig with the right public key, but wrong KEM ID, is an
  // error.
  ECHConfigParams wrong_kem;
  wrong_kem.key = key.get();
  wrong_kem.kem_id = 0x0010;  // DHKEM(P-256, HKDF-SHA256)
  ASSERT_TRUE(MakeECHConfig(&ech_config, wrong_kem));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));
}